

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O2

int Wla_ManCheckCombUnsat(Wla_Man_t *pWla,Aig_Man_t *pAig)

{
  uint uVar1;
  Pdr_Par_t *pPars;
  int iVar2;
  abctime aVar3;
  Aig_Man_t *p;
  abctime aVar4;
  Pdr_Man_t *p_00;
  abctime time;
  abctime time_00;
  Ssw_Pars_t ScorrPars;
  
  pPars = (Pdr_Par_t *)pWla->pPdrPars;
  if (pAig->nObjs[5] < 0x4e21) {
    aVar3 = Abc_Clock();
    Ssw_ManSetDefaultParams(&ScorrPars);
    ScorrPars.nFramesK = 1;
    ScorrPars.fStopWhenGone = ScorrPars.nFramesK;
    p = Ssw_SignalCorrespondence(pAig,&ScorrPars);
    if (p == (Aig_Man_t *)0x0) {
      __assert_fail("pAigScorr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs.c"
                    ,0x5ad,"int Wla_ManCheckCombUnsat(Wla_Man_t *, Aig_Man_t *)");
    }
    uVar1 = p->nObjs[5];
    Aig_ManStop(p);
    iVar2 = pWla->pPars->fVerbose;
    if (uVar1 == 0) {
      if (iVar2 == 0) {
        return 1;
      }
      aVar4 = Abc_Clock();
      Abc_PrintTime(0x87d314,(char *)(aVar4 - aVar3),time_00);
      return 1;
    }
    if (iVar2 != 0) {
      Abc_Print((int)p,"SCORR failed with %d ANDs. ",(ulong)uVar1);
      aVar4 = Abc_Clock();
      Abc_PrintTime(0x816bba,(char *)(aVar4 - aVar3),time);
    }
  }
  aVar3 = Abc_Clock();
  pPars->fVerbose = 0;
  p_00 = Pdr_ManStart(pAig,pPars,(Vec_Int_t *)0x0);
  iVar2 = IPdr_ManCheckCombUnsat(p_00);
  Pdr_ManStop(p_00);
  pPars->fVerbose = pWla->pPars->fPdrVerbose;
  aVar4 = Abc_Clock();
  pWla->tPdr = pWla->tPdr + (aVar4 - aVar3);
  return iVar2;
}

Assistant:

int Wla_ManCheckCombUnsat( Wla_Man_t * pWla, Aig_Man_t * pAig )
{
    Pdr_Man_t * pPdr;
    Pdr_Par_t * pPdrPars = (Pdr_Par_t *)pWla->pPdrPars;
    abctime clk;
    int RetValue = -1;

    if ( Aig_ManAndNum( pAig ) <= 20000 )
    { 
        Aig_Man_t * pAigScorr;
        Ssw_Pars_t ScorrPars, * pScorrPars = &ScorrPars;
        int nAnds;

        clk = Abc_Clock();

        Ssw_ManSetDefaultParams( pScorrPars );
        pScorrPars->fStopWhenGone = 1;
        pScorrPars->nFramesK = 1;
        pAigScorr = Ssw_SignalCorrespondence( pAig, pScorrPars );
        assert ( pAigScorr );
        nAnds = Aig_ManAndNum( pAigScorr); 
        Aig_ManStop( pAigScorr );

        if ( nAnds == 0 )
        {
            if ( pWla->pPars->fVerbose )
                Abc_PrintTime( 1, "SCORR proved UNSAT. Time", Abc_Clock() - clk );
            return 1;
        }
        else if ( pWla->pPars->fVerbose )
        {
            Abc_Print( 1, "SCORR failed with %d ANDs. ", nAnds);
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
    }

    clk = Abc_Clock();

    pPdrPars->fVerbose = 0;
    pPdr = Pdr_ManStart( pAig, pPdrPars, NULL );
    RetValue = IPdr_ManCheckCombUnsat( pPdr );
    Pdr_ManStop( pPdr );
    pPdrPars->fVerbose = pWla->pPars->fPdrVerbose;

    pWla->tPdr += Abc_Clock() - clk;

    return RetValue;
}